

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void opidx_dir_rel_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  (info->m680x).operands[bVar1].type = M680X_OP_CONSTANT;
  (info->m680x).operands[bVar1].field_1.direct_addr = (byte)MI->Opcode >> 1 & 7;
  direct_hdlr(MI,info,address);
  relative8_hdlr(MI,info,address);
  add_reg_to_rw_list(MI,M680X_REG_CC,MODIFY);
  return;
}

Assistant:

static void opidx_dir_rel_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	// bit index is coded in Opcode
	op->type = M680X_OP_CONSTANT;
	op->const_val = (MI->Opcode & 0x0e) >> 1;
	direct_hdlr(MI, info, address);
	relative8_hdlr(MI, info, address);

	add_reg_to_rw_list(MI, M680X_REG_CC, MODIFY);
}